

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

void __thiscall
SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::Clear
          (SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *this)

{
  NoCheckHeapAllocator *this_00;
  SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *pSVar1;
  SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *buffer;
  
  buffer = (SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *)
           (this->super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>).
           super_SListNodeBase<Memory::NoCheckHeapAllocator>.next;
  if (buffer != this) {
    this_00 = this->allocator;
    do {
      pSVar1 = (SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *)
               (buffer->super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>
               ).super_SListNodeBase<Memory::NoCheckHeapAllocator>.next;
      Memory::NoCheckHeapAllocator::Free(this_00,buffer,0x10);
      buffer = pSVar1;
    } while (pSVar1 != this);
  }
  (this->super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>).
  super_SListNodeBase<Memory::NoCheckHeapAllocator>.next = (Type)this;
  (this->super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>).
  super_RealCount.count = 0;
  return;
}

Assistant:

void Clear()
    {
        __super::Clear(allocator);
    }